

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planner.cpp
# Opt level: O1

void __thiscall
despot::Planner::Planner
          (Planner *this,string *lower_bounds_str,string *base_lower_bounds_str,
          string *upper_bounds_str,string *base_upper_bounds_str)

{
  pointer pcVar1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (lower_bounds_str->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + lower_bounds_str->_M_string_length);
  pcVar1 = (base_lower_bounds_str->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + base_lower_bounds_str->_M_string_length);
  pcVar1 = (upper_bounds_str->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + upper_bounds_str->_M_string_length);
  pcVar1 = (base_upper_bounds_str->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + base_upper_bounds_str->_M_string_length);
  PlannerBase::PlannerBase(&this->super_PlannerBase,&local_50,&local_70,&local_90,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_PlannerBase)._vptr_PlannerBase = (_func_int **)&PTR__Planner_00190740;
  this->step_ = 0;
  this->round_ = 0;
  return;
}

Assistant:

Planner::Planner(string lower_bounds_str,
		string base_lower_bounds_str, string upper_bounds_str, string base_upper_bounds_str)
		:PlannerBase(lower_bounds_str, base_lower_bounds_str, upper_bounds_str, base_upper_bounds_str){
	step_=0;
	round_=0;
}